

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0005(SemanticModelTester *this)

{
  DeclarationCategory DVar1;
  SymbolKind SVar2;
  bool bVar3;
  TypeKind TVar4;
  int iVar5;
  __tuple_element_t<0UL,_tuple<const_VariableAndOrFunctionDeclarationSyntax_*,_const_SemanticModel_*>_>
  *ppVVar6;
  size_type sVar7;
  ostream *poVar8;
  void *pvVar9;
  undefined8 uVar10;
  reference ppDVar11;
  undefined4 extraout_var;
  Lexeme *pLVar12;
  Type *pTVar13;
  undefined4 extraout_var_00;
  string local_148;
  string local_128;
  ObjectDeclarationSymbol *local_108;
  VariableDeclarationSymbol *varDeclSym2;
  DeclarationSymbol *declSym1;
  string local_d8;
  ObjectDeclarationSymbol *local_b8;
  VariableDeclarationSymbol *varDeclSym1;
  DeclarationSymbol *declSym0;
  vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_> syms
  ;
  type *semaModel;
  type *varAndOrFunDeclNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"x y , z ;",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&varAndOrFunDeclNode + 7));
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&varAndOrFunDeclNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  ppVVar6 = std::
            get<0ul,psy::C::VariableAndOrFunctionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                      ((tuple<const_psy::C::VariableAndOrFunctionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                        *)local_20);
  syms.
  super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                get<1ul,psy::C::VariableAndOrFunctionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                          ((tuple<const_psy::C::VariableAndOrFunctionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                            *)local_20);
  SemanticModel::variablesAndOrFunctionsFor
            ((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              *)&declSym0,
             (SemanticModel *)
             *syms.
              super__Vector_base<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppVVar6);
  sVar7 = std::
          vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
          ::size((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                  *)&declSym0);
  if (sVar7 != 2) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    sVar7 = std::
            vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
            ::size((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                    *)&declSym0);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar7);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xaf);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  ppDVar11 = std::
             vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
             ::operator[]((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                           *)&declSym0,0);
  varDeclSym1 = (VariableDeclarationSymbol *)*ppDVar11;
  if (varDeclSym1 == (VariableDeclarationSymbol *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xb2);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  DVar1 = DeclarationSymbol::category((DeclarationSymbol *)varDeclSym1);
  if (DVar1 != Object) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    DVar1 = DeclarationSymbol::category((DeclarationSymbol *)varDeclSym1);
    poVar8 = C::operator<<(poVar8,DVar1);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = C::operator<<(poVar8,Object);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xb3);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  SVar2 = Symbol::kind((Symbol *)varDeclSym1);
  if (SVar2 != VariableDeclaration) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    SVar2 = Symbol::kind((Symbol *)varDeclSym1);
    poVar8 = C::operator<<(poVar8,SVar2);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = C::operator<<(poVar8,VariableDeclaration);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xb4);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  iVar5 = (*(varDeclSym1->super_ObjectDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
            _vptr_Symbol[0xd])();
  local_b8 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var,iVar5);
  pLVar12 = &ObjectDeclarationSymbol::name(local_b8)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_d8,pLVar12);
  bVar3 = std::operator==(&local_d8,"y");
  std::__cxx11::string::~string((string *)&local_d8);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    pLVar12 = &ObjectDeclarationSymbol::name(local_b8)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_((string *)&declSym1,pLVar12);
    poVar8 = std::operator<<(poVar8,(string *)&declSym1);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = std::operator<<(poVar8,"y");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xb6);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&declSym1);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  pTVar13 = ObjectDeclarationSymbol::type(local_b8);
  TVar4 = Type::kind(pTVar13);
  if (TVar4 != Error) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    pTVar13 = ObjectDeclarationSymbol::type(local_b8);
    TVar4 = Type::kind(pTVar13);
    poVar8 = ::operator<<(poVar8,TVar4);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = ::operator<<(poVar8,Error);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xb7);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  ppDVar11 = std::
             vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
             ::operator[]((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
                           *)&declSym0,1);
  varDeclSym2 = (VariableDeclarationSymbol *)*ppDVar11;
  if (varDeclSym2 == (VariableDeclarationSymbol *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xba);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  DVar1 = DeclarationSymbol::category((DeclarationSymbol *)varDeclSym2);
  if (DVar1 != Object) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    DVar1 = DeclarationSymbol::category((DeclarationSymbol *)varDeclSym2);
    poVar8 = C::operator<<(poVar8,DVar1);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = C::operator<<(poVar8,Object);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xbb);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  SVar2 = Symbol::kind((Symbol *)varDeclSym2);
  if (SVar2 != VariableDeclaration) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    SVar2 = Symbol::kind((Symbol *)varDeclSym2);
    poVar8 = C::operator<<(poVar8,SVar2);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = C::operator<<(poVar8,VariableDeclaration);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0xbc);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  iVar5 = (*(varDeclSym2->super_ObjectDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
            _vptr_Symbol[0xd])();
  local_108 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var_00,iVar5);
  pLVar12 = &ObjectDeclarationSymbol::name(local_108)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_128,pLVar12);
  bVar3 = std::operator==(&local_128,"z");
  std::__cxx11::string::~string((string *)&local_128);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    pTVar13 = ObjectDeclarationSymbol::type(local_108);
    TVar4 = Type::kind(pTVar13);
    if (TVar4 != Error) {
      poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
      pTVar13 = ObjectDeclarationSymbol::type(local_108);
      TVar4 = Type::kind(pTVar13);
      poVar8 = ::operator<<(poVar8,TVar4);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
      poVar8 = ::operator<<(poVar8,Error);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\t");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      pvVar9 = (void *)std::ostream::operator<<(poVar8,0xbf);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      uVar10 = __cxa_allocate_exception(1);
      __cxa_throw(uVar10,&TestFailed::typeinfo,0);
    }
    std::
    vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>::
    ~vector((vector<const_psy::C::DeclarationSymbol_*,_std::allocator<const_psy::C::DeclarationSymbol_*>_>
             *)&declSym0);
    return;
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
  poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
  pLVar12 = &ObjectDeclarationSymbol::name(local_108)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_148,pLVar12);
  poVar8 = std::operator<<(poVar8,(string *)&local_148);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
  poVar8 = std::operator<<(poVar8,"z");
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"\t\t");
  poVar8 = std::operator<<(poVar8,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                          );
  poVar8 = std::operator<<(poVar8,":");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,0xbe);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_148);
  uVar10 = __cxa_allocate_exception(1);
  __cxa_throw(uVar10,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0005()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("x y , z ;");

    auto syms = semaModel->variablesAndOrFunctionsFor(varAndOrFunDeclNode);
    PSY_EXPECT_EQ_INT(syms.size(), 2);

    const DeclarationSymbol* declSym0 = syms[0];
    PSY_EXPECT_TRUE(declSym0);
    PSY_EXPECT_EQ_ENU(declSym0->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym0->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym1 = declSym0->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym1->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(varDeclSym1->type()->kind(), TypeKind::Error, TypeKind);

    const DeclarationSymbol* declSym1 = syms[1];
    PSY_EXPECT_TRUE(declSym1);
    PSY_EXPECT_EQ_ENU(declSym1->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym1->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym2 = declSym1->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym2->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(varDeclSym2->type()->kind(), TypeKind::Error, TypeKind);
}